

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLFileReader<fmt::File>::Read<SparsityPrinter>
          (NLFileReader<fmt::File> *this,CStringRef filename,SparsityPrinter *handler,int flags)

{
  CStringRef name;
  CStringRef name_00;
  int in_R9D;
  NLStringRef str;
  NLStringRef str_00;
  MemoryMappedFile<fmt::File> mapped_file;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> local_58;
  
  Open(this,filename);
  if (this->size_ == this->rounded_size_) {
    local_58.super_Buffer<char>.size_ = 0;
    local_58.super_Buffer<char>.capacity_ = 1;
    local_58.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0014c668;
    local_58.super_Buffer<char>.ptr_ = local_58.data_;
    Read(this,&local_58);
    name.data_._4_4_ = 0;
    name.data_._0_4_ = flags;
    str.size_ = (size_t)handler;
    str.data_ = (char *)this->size_;
    ReadNLString<SparsityPrinter>
              ((mp *)local_58.super_Buffer<char>.ptr_,str,(SparsityPrinter *)filename.data_,name,
               in_R9D);
    local_58.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0014c668;
    if (local_58.super_Buffer<char>.ptr_ != local_58.data_) {
      operator_delete(local_58.super_Buffer<char>.ptr_,local_58.super_Buffer<char>.capacity_);
    }
  }
  else {
    MemoryMappedFile<fmt::File>::MemoryMappedFile
              ((MemoryMappedFile<fmt::File> *)&local_58,&this->file_,this->rounded_size_);
    name_00.data_._4_4_ = 0;
    name_00.data_._0_4_ = flags;
    str_00.size_ = (size_t)handler;
    str_00.data_ = (char *)this->size_;
    ReadNLString<SparsityPrinter>
              ((mp *)local_58.super_Buffer<char>._vptr_Buffer,str_00,
               (SparsityPrinter *)filename.data_,name_00,in_R9D);
    MemoryMappedFileBase::~MemoryMappedFileBase((MemoryMappedFileBase *)&local_58);
  }
  return;
}

Assistant:

void Read(fmt::CStringRef filename, Handler &handler, int flags) {
    Open(filename);
    if (size_ == rounded_size_) {
      // Don't use mmap, because the file size is a multiple of the page size
      // and therefore the mmap'ed buffer won't be null-terminated.
      fmt::internal::MemoryBuffer<char, 1> array;
      Read(array);
      return ReadNLString(
            NLStringRef(&array[0], size_), handler, filename, flags);
    }
    MemoryMappedFile<File> mapped_file(file_, rounded_size_);
    ReadNLString(
          NLStringRef(mapped_file.start(), size_), handler, filename, flags);
  }